

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBCellFlag.cpp
# Opt level: O0

NumCells * amrex::anon_unknown_26::countCells(Array4<const_amrex::EBCellFlag> *flag,Box *bx)

{
  int iVar1;
  Long LVar2;
  void *in_RSI;
  NumCells *in_RDI;
  int ncovered;
  int ncells;
  int nmulti;
  int nsingle;
  int nregular;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar3;
  undefined1 auStack_60 [16];
  anon_class_88_4_59dc350c *in_stack_ffffffffffffffb0;
  Box *in_stack_ffffffffffffffb8;
  
  LVar2 = Box::numPts((Box *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  iVar1 = (int)LVar2;
  memcpy(auStack_60,in_RSI,0x3c);
  LoopOnCpu<amrex::(anonymous_namespace)::countCells(amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Box_const&)::__1>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  iVar3 = iVar1;
  EBCellFlagFab::NumCells::NumCells(in_RDI);
  if (iVar1 == 0) {
    in_RDI->type = regular;
  }
  else if (iVar3 == iVar1) {
    in_RDI->type = covered;
  }
  else {
    in_RDI->type = singlevalued;
  }
  in_RDI->nregular = 0;
  in_RDI->nsingle = 0;
  in_RDI->nmulti = 0;
  in_RDI->ncovered = iVar3;
  return in_RDI;
}

Assistant:

EBCellFlagFab::NumCells countCells (Array4<EBCellFlag const> const& flag, const Box& bx) noexcept
{
    int nregular=0, nsingle=0, nmulti=0;
    int ncells = static_cast<int>(bx.numPts());
    AMREX_ASSERT(bx.numPts() <= static_cast<Long>(std::numeric_limits<int>::max()));

    if (Gpu::inLaunchRegion())
    {
        ReduceOps<ReduceOpSum,ReduceOpSum,ReduceOpSum> reduce_op;
        ReduceData<int,int,int> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;
        reduce_op.eval(bx, reduce_data,
        [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
        {
            int nr=0, ns=0, nm=0;
            auto f = flag(i,j,k);
            if (f.isRegular()) {
                ++nr;
            } else if (f.isSingleValued()) {
                ++ns;
            } else if (f.isMultiValued()) {
                ++nm;
            }
            return {nr, ns, nm};
        });
        ReduceTuple hv = reduce_data.value(reduce_op);
        nregular = amrex::get<0>(hv);
        nsingle  = amrex::get<1>(hv);
        nmulti   = amrex::get<2>(hv);
    }
    else
    {
        amrex::LoopOnCpu(bx,
        [=,&nregular,&nsingle,&nmulti] (int i, int j, int k) noexcept
        {
            auto f = flag(i,j,k);
            if (f.isRegular()) {
                ++nregular;
            } else if (f.isSingleValued()) {
                ++nsingle;
            } else if (f.isMultiValued()) {
                ++nmulti;
            }
        });
    }

    int ncovered = ncells - nregular - nsingle - nmulti;

    EBCellFlagFab::NumCells r;
    if (nregular == ncells) {
        r.type = FabType::regular;
    } else if (ncovered == ncells) {
        r.type = FabType::covered;
    } else if (nmulti > 0) {
        r.type = FabType::multivalued;
    } else {
        r.type = FabType::singlevalued;
    }
    r.nregular = nregular;
    r.nsingle = nsingle;
    r.nmulti = nmulti;
    r.ncovered = ncovered;
    return r;
}